

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize<FString>(FSerializer *arc,char *key,FString **pstr,FString **def)

{
  FWriter *this;
  bool bVar1;
  Value *this_00;
  Ch *cc;
  char *pcVar2;
  FString *pFVar3;
  bool local_39;
  Value *val;
  FString **def_local;
  FString **pstr_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (def == (FString **)0x0)) || (*pstr != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*pstr == (FString *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        this = arc->w;
        pcVar2 = FString::GetChars(*pstr);
        FWriter::String(this,pcVar2);
      }
    }
  }
  else {
    this_00 = FReader::FindKey(arc->r,key);
    if (this_00 != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this_00);
      local_39 = true;
      if (!bVar1) {
        local_39 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::IsString(this_00);
      }
      if (local_39 == false) {
        __assert_fail("val->IsNull() || val->IsString()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x814,
                      "FSerializer &Serialize(FSerializer &, const char *, FString *&, FString **)")
        ;
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this_00);
      if (bVar1) {
        *pstr = (FString *)0x0;
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsString(this_00);
        if (bVar1) {
          cc = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_00);
          pcVar2 = UnicodeToString(cc);
          pFVar3 = FSharedStringArena::Alloc(&AActor::mStringPropertyData,pcVar2);
          *pstr = pFVar3;
        }
        else {
          Printf("\x1cGstring expected for \'%s\'",key);
          *pstr = (FString *)0x0;
          arc->mErrors = arc->mErrors + 1;
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FString *&pstr, FString **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || pstr != *def)
		{
			arc.WriteKey(key);
			if (pstr == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(pstr->GetChars());
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsNull() || val->IsString());
			if (val->IsNull())
			{
				pstr = nullptr;
			}
			else if (val->IsString())
			{
				pstr = AActor::mStringPropertyData.Alloc(UnicodeToString(val->GetString()));
			}
			else
			{
				Printf(TEXTCOLOR_RED "string expected for '%s'", key);
				pstr = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;

}